

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magicBoxTest.cc
# Opt level: O2

void __thiscall example_add_Test::TestBody(example_add_Test *this)

{
  char *message;
  char *in_stack_ffffffffffffffc8;
  char *pcStack_30;
  MagicBox mb;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  AssertionResult gtest_ar;
  
  MagicBox::smash(&mb,5.0,3);
  testing::internal::DoubleNearPredFormat
            (pcStack_30,in_stack_ffffffffffffffc8,(char *)0x120f80,(double)gtest_ar.message_.ptr_,
             (double)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             (double)in_stack_ffffffffffffffe0.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffe0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jdalt[P]nan-plus-unit-tests/test_native/magicBoxTest.cc"
               ,9,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffe0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffe0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(example, add)
{
    double res;
    MagicBox mb;
    res = mb.smash(5.0, 3);
    ASSERT_NEAR(res, 15.0, 1.0e-11);
}